

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O1

void wasm::TypeUpdating::handleNonDefaultableLocals(Function *func,Module *wasm)

{
  size_t *this;
  uint index_00;
  pointer pTVar1;
  pointer pTVar2;
  Expression **ppEVar3;
  LocalGet *get;
  Expression **ppEVar4;
  LocalSet *this_00;
  undefined8 *puVar5;
  Function *pFVar6;
  Function *this_01;
  bool bVar7;
  bool bVar8;
  _Base_ptr p_Var9;
  size_type sVar10;
  Expression *pEVar11;
  HeapType heapType;
  RefAs *this_02;
  Type TVar12;
  size_t sVar13;
  char *__function;
  pointer pTVar14;
  pointer pppEVar15;
  pointer pppEVar16;
  undefined1 local_d8 [8];
  LocalStructuralDominance info;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  badIndexes;
  FindAllPointers<wasm::LocalGet> local_58;
  Type local_40;
  uint index;
  
  if (((wasm->features).features & 0x1100) == 0x100) {
    pTVar1 = (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    pTVar2 = (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pTVar1 != pTVar2) {
      bVar8 = false;
      this = &info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_node_count;
      _index = func;
      do {
        pTVar14 = pTVar1 + 1;
        info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_node_count = pTVar1->id;
        bVar7 = wasm::Type::isNonNullable((Type *)this);
        if (bVar7) {
          bVar8 = true;
          break;
        }
        pTVar1 = pTVar14;
      } while (pTVar14 != pTVar2);
      if (bVar8) {
        LocalStructuralDominance::LocalStructuralDominance
                  ((LocalStructuralDominance *)local_d8,_index,wasm,NonNullableOnly);
        info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)&badIndexes._M_h._M_rehash_policy._M_next_resize;
        badIndexes._M_h._M_buckets = (__buckets_ptr)0x1;
        badIndexes._M_h._M_bucket_count = 0;
        badIndexes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        badIndexes._M_h._M_element_count._0_4_ = 0x3f800000;
        badIndexes._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        badIndexes._M_h._M_rehash_policy._4_4_ = 0;
        badIndexes._M_h._M_rehash_policy._M_next_resize = 0;
        if (info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
            (_Rb_tree_node_base *)&info) {
          p_Var9 = info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            local_40.id._0_4_ = p_Var9[1]._M_color;
            local_58.list.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)this;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)this,&local_40,&local_58);
            local_58.list.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)Function::getLocalType(_index,(_Rb_tree_color)local_40.id);
            bVar8 = wasm::Type::isNonNullable((Type *)&local_58);
            if (!bVar8) {
              __assert_fail("func->getLocalType(index).isNonNullable()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/type-updating.cpp"
                            ,0x154,
                            "void wasm::TypeUpdating::handleNonDefaultableLocals(Function *, Module &)"
                           );
            }
            bVar8 = Function::isParam(_index,(_Rb_tree_color)local_40.id);
            if (bVar8) {
              __assert_fail("!func->isParam(index)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/type-updating.cpp"
                            ,0x155,
                            "void wasm::TypeUpdating::handleNonDefaultableLocals(Function *, Module &)"
                           );
            }
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          } while (p_Var9 != (_Rb_tree_node_base *)&info);
        }
        if (badIndexes._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
          ppEVar4 = &_index->body;
          FindAllPointers<wasm::LocalGet>::FindAllPointers(&local_58,ppEVar4);
          pppEVar15 = local_58.list.
                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          for (pppEVar16 = local_58.list.
                           super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                           ._M_impl.super__Vector_impl_data._M_start; pppEVar16 != pppEVar15;
              pppEVar16 = pppEVar16 + 1) {
            ppEVar3 = *pppEVar16;
            get = (LocalGet *)*ppEVar3;
            if ((get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id !=
                LocalGetId) {
              __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
              goto LAB_00aaf0d4;
            }
            sVar10 = std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)&info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count,&get->index);
            if (sVar10 != 0) {
              pEVar11 = fixLocalGet(get,wasm);
              *ppEVar3 = pEVar11;
            }
          }
          if (local_58.list.
              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.list.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_58.list.
                                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.list.
                                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          FindAllPointers<wasm::LocalSet>::FindAllPointers
                    ((FindAllPointers<wasm::LocalSet> *)&local_58,ppEVar4);
          if (local_58.list.
              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_58.list.
              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pppEVar15 = local_58.list.
                        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            do {
              ppEVar4 = *pppEVar15;
              this_00 = (LocalSet *)*ppEVar4;
              if ((this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id
                  != LocalSetId) {
                __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
LAB_00aaf0d4:
                __assert_fail("int(_id) == int(T::SpecificId)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                              ,0x314,__function);
              }
              bVar8 = Function::isVar(_index,this_00->index);
              if (((bVar8) && (bVar8 = LocalSet::isTee(this_00), bVar8)) &&
                 ((this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type
                  .id != 1)) {
                sVar10 = std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                  *)&info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count,&this_00->index);
                if (sVar10 != 0) {
                  local_40 = Function::getLocalType(_index,this_00->index);
                  heapType = wasm::Type::getHeapType(&local_40);
                  wasm::Type::Type((Type *)&badIndexes._M_h._M_single_bucket,heapType,Nullable);
                  (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type
                  .id = (uintptr_t)badIndexes._M_h._M_single_bucket;
                  this_02 = (RefAs *)MixedArena::allocSpace(&wasm->allocator,0x20,8);
                  (this_02->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression._id
                       = RefAsId;
                  (this_02->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.
                  type.id = 0;
                  this_02->op = RefAsNonNull;
                  this_02->value = (Expression *)this_00;
                  RefAs::finalize(this_02);
                  *ppEVar4 = (Expression *)this_02;
                }
              }
              pppEVar15 = pppEVar15 + 1;
            } while (pppEVar15 !=
                     local_58.list.
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          }
          puVar5 = (undefined8 *)badIndexes._M_h._M_bucket_count;
          pFVar6 = _index;
          if (local_58.list.
              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.list.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_58.list.
                                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.list.
                                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            puVar5 = (undefined8 *)badIndexes._M_h._M_bucket_count;
            pFVar6 = _index;
          }
          for (; this_01 = _index, _index = pFVar6, puVar5 != (undefined8 *)0x0;
              puVar5 = (undefined8 *)*puVar5) {
            index_00 = *(uint *)(puVar5 + 1);
            TVar12 = Function::getLocalType(this_01,index_00);
            TVar12 = getValidLocalType(TVar12,(FeatureSet)(wasm->features).features);
            sVar13 = Function::getNumParams(this_01);
            (this_01->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start[index_00 - sVar13].id = TVar12.id;
            pFVar6 = _index;
            _index = this_01;
          }
        }
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_node_count
                     );
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_d8);
      }
    }
  }
  return;
}

Assistant:

void handleNonDefaultableLocals(Function* func, Module& wasm) {
  if (wasm.features.hasGCNNLocals()) {
    // We have nothing to fix up: all locals are allowed.
    return;
  }
  if (!wasm.features.hasReferenceTypes()) {
    // No references, so no non-nullable ones at all.
    return;
  }
  bool hasNonNullable = false;
  for (auto type : func->vars) {
    if (type.isNonNullable()) {
      hasNonNullable = true;
      break;
    }
  }
  if (!hasNonNullable) {
    // No non-nullable types exist in practice.
    return;
  }

  // Non-nullable locals exist, which we may need to fix up. See if they
  // validate as they are, that is, if they fall within the validation rules of
  // the wasm spec. We do not need to modify such locals.
  LocalStructuralDominance info(
    func, wasm, LocalStructuralDominance::NonNullableOnly);
  std::unordered_set<Index> badIndexes;
  for (auto index : info.nonDominatingIndices) {
    badIndexes.insert(index);

    // LocalStructuralDominance should have only looked at non-nullable indexes
    // since we told it to ignore nullable ones. Also, params always dominate
    // and should not appear here.
    assert(func->getLocalType(index).isNonNullable());
    assert(!func->isParam(index));
  }
  if (badIndexes.empty()) {
    return;
  }

  // Rewrite the local.gets.
  Builder builder(wasm);
  for (auto** getp : FindAllPointers<LocalGet>(func->body).list) {
    auto* get = (*getp)->cast<LocalGet>();
    if (badIndexes.count(get->index)) {
      *getp = fixLocalGet(get, wasm);
    }
  }

  // Update tees, whose type must match the local (if the wasm spec changes for
  // the type to be that of the value, then this can be removed).
  for (auto** setp : FindAllPointers<LocalSet>(func->body).list) {
    auto* set = (*setp)->cast<LocalSet>();
    if (!func->isVar(set->index)) {
      // We do not need to process params, which can legally be non-nullable.
      continue;
    }
    // Non-tees do not change, and unreachable tees can be ignored here as their
    // type is unreachable anyhow.
    if (!set->isTee() || set->type == Type::unreachable) {
      continue;
    }
    if (badIndexes.count(set->index)) {
      auto type = func->getLocalType(set->index);
      set->type = Type(type.getHeapType(), Nullable);
      *setp = builder.makeRefAs(RefAsNonNull, set);
    }
  }

  // Rewrite the types of the function's vars (which we can do now, after we
  // are done using them to know which local.gets etc to fix).
  for (auto index : badIndexes) {
    func->vars[index - func->getNumParams()] =
      getValidLocalType(func->getLocalType(index), wasm.features);
  }
}